

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcSampleVariablesTests.cpp
# Opt level: O0

IterateResult __thiscall deqp::SampleShadingMaskCase::iterate(SampleShadingMaskCase *this)

{
  void **this_00;
  allocator<tcu::Vector<float,_4>_> *this_01;
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  code *pcVar5;
  code *pcVar6;
  bool bVar7;
  int iVar8;
  deUint32 dVar9;
  undefined4 uVar10;
  int iVar11;
  RenderContext *pRVar12;
  undefined4 extraout_var;
  ContextInfo *pCVar13;
  char *pcVar14;
  TestError *pTVar15;
  TextureFormat *pTVar16;
  reference pvVar17;
  size_type sVar18;
  reference pvVar19;
  reference pvVar20;
  ulong uVar21;
  char *local_b60;
  float local_b1c;
  VertexArrayBinding *local_a08;
  int local_8b4;
  VertexArrayBinding *local_898;
  bool local_7da;
  bool local_7d9;
  Vector<float,_4> local_7d0;
  Vector<float,_4> local_7c0;
  undefined1 local_7b0 [16];
  undefined1 local_7a0 [8];
  Vec4 pixel;
  int sample;
  GLint samples;
  int x;
  int y;
  float local_778 [2];
  uint local_770;
  allocator<unsigned_int> local_769;
  uint i_1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> data_1;
  undefined8 local_748;
  uint local_740;
  allocator<int> local_739;
  uint i;
  vector<int,_std::allocator<int>_> data;
  undefined1 local_718 [8];
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> result;
  PixelBufferAccess pixels;
  TextureLevel results;
  allocator<char> local_691;
  string local_690;
  undefined1 *local_670;
  undefined1 local_668 [8];
  VertexArrayBinding vertexArrays_1 [1];
  allocator<char> local_60a;
  allocator<char> local_609;
  string local_608;
  string local_5e8;
  string local_5c8;
  allocator<char> local_5a2;
  allocator<char> local_5a1;
  string local_5a0;
  string local_580;
  string local_560;
  ProgramSources local_540;
  undefined1 local_470 [8];
  ShaderProgram program_1;
  undefined4 local_398;
  GLuint fbo;
  GLuint rbo;
  GLsizei width;
  undefined1 local_372;
  allocator<char> local_371;
  string local_370;
  undefined1 *local_350;
  undefined1 local_348 [8];
  VertexArrayBinding vertexArrays [1];
  string local_2f0;
  string local_2d0;
  string local_2b0;
  allocator<char> local_28d [20];
  allocator<char> local_279;
  string local_278;
  string local_258;
  string local_238;
  ProgramSources local_218;
  undefined1 local_148 [8];
  ShaderProgram program;
  GLfloat color_2 [4];
  GLuint color_1 [4];
  GLint color [4];
  undefined4 local_40;
  undefined4 local_3c;
  GLuint fboMs;
  GLenum target;
  GLuint tex;
  GLint maxSamples;
  bool supportsRgba32f;
  long lStack_28;
  bool isOk;
  Functions *gl;
  TestLog *log;
  SampleShadingMaskCase *this_local;
  
  log = (TestLog *)this;
  gl = (Functions *)
       tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  pRVar12 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar8 = (*pRVar12->_vptr_RenderContext[3])();
  lStack_28 = CONCAT44(extraout_var,iVar8);
  maxSamples._3_1_ = 1;
  maxSamples._2_1_ = 0;
  if (this->m_glslVersion == GLSL_VERSION_310_ES) {
    pCVar13 = deqp::Context::getContextInfo((this->super_TestCase).m_context);
    bVar7 = glu::ContextInfo::isExtensionSupported(pCVar13,"GL_OES_sample_variables");
    if (!bVar7) {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                 QP_TEST_RESULT_NOT_SUPPORTED,"GL_OES_sample_variables");
      return STOP;
    }
  }
  pRVar12 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  tex = (*pRVar12->_vptr_RenderContext[2])();
  bVar7 = glu::isContextTypeGLCore((ContextType)tex);
  if (bVar7) {
    local_7d9 = true;
  }
  else {
    pCVar13 = deqp::Context::getContextInfo((this->super_TestCase).m_context);
    bVar7 = glu::ContextInfo::isExtensionSupported(pCVar13,"GL_EXT_color_buffer_float");
    local_7da = true;
    if (!bVar7) {
      pCVar13 = deqp::Context::getContextInfo((this->super_TestCase).m_context);
      local_7da = glu::ContextInfo::isExtensionSupported(pCVar13,"GL_ARB_color_buffer_float");
    }
    local_7d9 = local_7da;
  }
  maxSamples._2_1_ = local_7d9;
  if ((this->m_internalFormat == 0x8814) && (local_7d9 == false)) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_NOT_SUPPORTED,"Internalformat rgba32f not supported");
    this_local._4_4_ = STOP;
  }
  else {
    if ((((((this->m_texFormat).type == FLOAT) && ((this->m_texFormat).order == RGBA)) ||
         (((this->m_texFormat).type == FLOAT && ((this->m_texFormat).order == RG)))) ||
        (((this->m_texFormat).type == FLOAT && ((this->m_texFormat).order == R)))) ||
       (((this->m_texFormat).type == HALF_FLOAT && ((this->m_texFormat).order == RGBA)))) {
      (**(code **)(lStack_28 + 0x880))(0x9100,this->m_internalFormat,0x80a9,1,&target);
      if ((int)target < this->m_samples) {
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_NOT_SUPPORTED,
                   "Test sample count greater than samples that the format supports");
        return STOP;
      }
    }
    else if (((this->m_texFormat).type == SIGNED_INT8) ||
            ((this->m_texFormat).type == UNSIGNED_INT8)) {
      (**(code **)(lStack_28 + 0x868))(0x9110,&target);
      if ((int)target < this->m_samples) {
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_NOT_SUPPORTED,"Test sample count greater than MAX_INTEGER_SAMPLES"
                  );
        return STOP;
      }
    }
    else {
      (**(code **)(lStack_28 + 0x868))(0x8d57,&target);
      if ((int)target < this->m_samples) {
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_NOT_SUPPORTED,"Test sample count greater than MAX_SAMPLES");
        return STOP;
      }
    }
    (**(code **)(lStack_28 + 0x6f8))(1,&fboMs);
    if (this->m_samples == 0) {
      local_3c = 0xde1;
      (**(code **)(lStack_28 + 0xb8))(0xde1,fboMs);
      (**(code **)(lStack_28 + 0x1380))(0xde1,1,this->m_internalFormat,0x10);
      if ((((this->m_texFormat).type == SIGNED_INT8) || ((this->m_texFormat).type == UNSIGNED_INT8))
         || ((this->m_texFormat).type == FLOAT)) {
        (**(code **)(lStack_28 + 0x1360))(0xde1,0x2800,0x2600);
        (**(code **)(lStack_28 + 0x1360))(0xde1,0x2801,0x2600);
      }
    }
    else {
      local_3c = 0x9100;
      (**(code **)(lStack_28 + 0xb8))(0x9100,fboMs);
      (**(code **)(lStack_28 + 0x1390))(0x9100,this->m_samples,this->m_internalFormat,0x10,0x10,0);
    }
    (**(code **)(lStack_28 + 0x6d0))(1,&local_40);
    (**(code **)(lStack_28 + 0x78))(0x8d40,local_40);
    (**(code **)(lStack_28 + 0x6a0))(0x8d40,0x8ce0,local_3c,fboMs,0);
    (**(code **)(lStack_28 + 0x1a00))(0,0,0x10);
    if ((this->m_texFormat).type == SIGNED_INT8) {
      color_1[2] = 0;
      color_1[3] = 1;
      (**(code **)(lStack_28 + 0x1b0))(0x1800,0,color_1 + 2);
    }
    else if ((this->m_texFormat).type == UNSIGNED_INT8) {
      color_2[2] = 0.0;
      color_2[3] = 1.4013e-45;
      color_1[0] = 0;
      color_1[1] = 1;
      (**(code **)(lStack_28 + 0x1b8))(0x1800,0,color_2 + 2);
    }
    else {
      program.m_program.m_info.linkTimeUs = 0x3f80000000000000;
      color_2[0] = 0.0;
      color_2[1] = 1.0;
      (**(code **)(lStack_28 + 0x1a8))(0x1800,0,&program.m_program.m_info.linkTimeUs);
    }
    pRVar12 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
    pcVar14 = iterate::vss;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_278,pcVar14,&local_279);
    specializeVersion(&local_258,&local_278,this->m_glslVersion,&this->m_sampler,&this->m_outType);
    pcVar14 = (char *)std::__cxx11::string::c_str();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_238,pcVar14,local_28d);
    pcVar14 = iterate::fss;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2f0,pcVar14,
               (allocator<char> *)((long)&vertexArrays[0].pointer.data + 7));
    specializeVersion(&local_2d0,&local_2f0,this->m_glslVersion,&this->m_sampler,&this->m_outType);
    pcVar14 = (char *)std::__cxx11::string::c_str();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2b0,pcVar14,
               (allocator<char> *)((long)&vertexArrays[0].pointer.data + 6));
    glu::makeVtxFragSources(&local_218,&local_238,&local_2b0);
    glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_148,pRVar12,&local_218);
    glu::ProgramSources::~ProgramSources(&local_218);
    std::__cxx11::string::~string((string *)&local_2b0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&vertexArrays[0].pointer.data + 6));
    std::__cxx11::string::~string((string *)&local_2d0);
    std::__cxx11::string::~string((string *)&local_2f0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&vertexArrays[0].pointer.data + 7));
    std::__cxx11::string::~string((string *)&local_238);
    std::allocator<char>::~allocator(local_28d);
    std::__cxx11::string::~string((string *)&local_258);
    std::__cxx11::string::~string((string *)&local_278);
    std::allocator<char>::~allocator(&local_279);
    glu::operator<<((TestLog *)gl,(ShaderProgram *)local_148);
    bVar7 = glu::ShaderProgram::isOk((ShaderProgram *)local_148);
    if (!bVar7) {
      pTVar15 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar15,"Compile failed",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcSampleVariablesTests.cpp"
                 ,0x169);
      __cxa_throw(pTVar15,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    pcVar5 = *(code **)(lStack_28 + 0x1680);
    dVar9 = glu::ShaderProgram::getProgram((ShaderProgram *)local_148);
    (*pcVar5)(dVar9);
    pcVar5 = *(code **)(lStack_28 + 0x14f0);
    pcVar6 = *(code **)(lStack_28 + 0xb48);
    dVar9 = glu::ShaderProgram::getProgram((ShaderProgram *)local_148);
    uVar10 = (*pcVar6)(dVar9,"u_sampleMask");
    (*pcVar5)(uVar10,this->m_sampleMask);
    local_372 = 1;
    local_350 = local_348;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_370,"a_position",&local_371)
    ;
    glu::va::Float((VertexArrayBinding *)local_348,&local_370,2,4,0,iterate::position);
    local_372 = 0;
    std::__cxx11::string::~string((string *)&local_370);
    std::allocator<char>::~allocator(&local_371);
    pRVar12 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
    dVar9 = glu::ShaderProgram::getProgram((ShaderProgram *)local_148);
    glu::pr::TriangleStrip((PrimitiveList *)&rbo,6,iterate::quadIndices);
    glu::draw(pRVar12,dVar9,1,(VertexArrayBinding *)local_348,(PrimitiveList *)&rbo,
              (DrawUtilCallback *)0x0);
    dVar9 = (**(code **)(lStack_28 + 0x800))();
    glu::checkError(dVar9,"Draw quad",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcSampleVariablesTests.cpp"
                    ,0x179);
    local_898 = (VertexArrayBinding *)&vertexArrays[0].pointer.data;
    do {
      local_898 = local_898 + -1;
      glu::VertexArrayBinding::~VertexArrayBinding(local_898);
    } while (local_898 != (VertexArrayBinding *)local_348);
    glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_148);
    pcVar5 = *(code **)(lStack_28 + 0x78);
    pRVar12 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
    iVar8 = (*pRVar12->_vptr_RenderContext[6])();
    (*pcVar5)(0x8d40,iVar8);
    (**(code **)(lStack_28 + 0x440))(1,&local_40);
    if (this->m_samples == 0) {
      local_8b4 = 1;
    }
    else {
      local_8b4 = this->m_samples;
    }
    fbo = local_8b4 << 4;
    (**(code **)(lStack_28 + 0x6e8))(1,&local_398);
    (**(code **)(lStack_28 + 0xa0))(0x8d41,local_398);
    (**(code **)(lStack_28 + 0x1238))(0x8d41,this->m_internalFormat,fbo);
    (**(code **)(lStack_28 + 0x6d0))
              (1,(undefined1 *)((long)&program_1.m_program.m_info.linkTimeUs + 4));
    (**(code **)(lStack_28 + 0x78))(0x8d40,program_1.m_program.m_info.linkTimeUs._4_4_);
    (**(code **)(lStack_28 + 0x688))(0x8d40,0x8ce0,0x8d41,local_398);
    (**(code **)(lStack_28 + 0x1a00))(0,0,fbo,0x10);
    pRVar12 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
    pcVar14 = iterate()::vss;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_5a0,pcVar14,&local_5a1);
    specializeVersion(&local_580,&local_5a0,this->m_glslVersion,&this->m_sampler,&this->m_outType);
    pcVar14 = (char *)std::__cxx11::string::c_str();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_560,pcVar14,&local_5a2);
    pcVar14 = iterate()::fss;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_608,pcVar14,&local_609);
    specializeVersion(&local_5e8,&local_608,this->m_glslVersion,&this->m_sampler,&this->m_outType);
    pcVar14 = (char *)std::__cxx11::string::c_str();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_5c8,pcVar14,&local_60a);
    glu::makeVtxFragSources(&local_540,&local_560,&local_5c8);
    glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_470,pRVar12,&local_540);
    glu::ProgramSources::~ProgramSources(&local_540);
    std::__cxx11::string::~string((string *)&local_5c8);
    std::allocator<char>::~allocator(&local_60a);
    std::__cxx11::string::~string((string *)&local_5e8);
    std::__cxx11::string::~string((string *)&local_608);
    std::allocator<char>::~allocator(&local_609);
    std::__cxx11::string::~string((string *)&local_560);
    std::allocator<char>::~allocator(&local_5a2);
    std::__cxx11::string::~string((string *)&local_580);
    std::__cxx11::string::~string((string *)&local_5a0);
    std::allocator<char>::~allocator(&local_5a1);
    glu::operator<<((TestLog *)gl,(ShaderProgram *)local_470);
    bVar7 = glu::ShaderProgram::isOk((ShaderProgram *)local_470);
    if (!bVar7) {
      pTVar15 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar15,"Compile failed",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcSampleVariablesTests.cpp"
                 ,0x1ae);
      __cxa_throw(pTVar15,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    pcVar5 = *(code **)(lStack_28 + 0x1680);
    dVar9 = glu::ShaderProgram::getProgram((ShaderProgram *)local_470);
    (*pcVar5)(dVar9);
    pcVar5 = *(code **)(lStack_28 + 0x14f0);
    pcVar6 = *(code **)(lStack_28 + 0xb48);
    dVar9 = glu::ShaderProgram::getProgram((ShaderProgram *)local_470);
    uVar10 = (*pcVar6)(dVar9,"u_samples");
    (*pcVar5)(uVar10,this->m_samples);
    if (this->m_samples < 1) {
      pcVar5 = *(code **)(lStack_28 + 0x14f0);
      pcVar6 = *(code **)(lStack_28 + 0xb48);
      dVar9 = glu::ShaderProgram::getProgram((ShaderProgram *)local_470);
      uVar10 = (*pcVar6)(dVar9,"u_tex");
      (*pcVar5)(uVar10,0);
      pcVar5 = *(code **)(lStack_28 + 0x14f0);
      pcVar6 = *(code **)(lStack_28 + 0xb48);
      dVar9 = glu::ShaderProgram::getProgram((ShaderProgram *)local_470);
      uVar10 = (*pcVar6)(dVar9,"u_texMS");
      (*pcVar5)(uVar10,1);
    }
    else {
      pcVar5 = *(code **)(lStack_28 + 0x14f0);
      pcVar6 = *(code **)(lStack_28 + 0xb48);
      dVar9 = glu::ShaderProgram::getProgram((ShaderProgram *)local_470);
      uVar10 = (*pcVar6)(dVar9,"u_tex");
      (*pcVar5)(uVar10,1);
      pcVar5 = *(code **)(lStack_28 + 0x14f0);
      pcVar6 = *(code **)(lStack_28 + 0xb48);
      dVar9 = glu::ShaderProgram::getProgram((ShaderProgram *)local_470);
      uVar10 = (*pcVar6)(dVar9,"u_texMS");
      (*pcVar5)(uVar10,0);
    }
    local_670 = local_668;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_690,"a_position",&local_691)
    ;
    glu::va::Float((VertexArrayBinding *)local_668,&local_690,2,4,0,iterate()::position);
    std::__cxx11::string::~string((string *)&local_690);
    std::allocator<char>::~allocator(&local_691);
    pRVar12 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
    dVar9 = glu::ShaderProgram::getProgram((ShaderProgram *)local_470);
    glu::pr::TriangleStrip((PrimitiveList *)&results.m_data.m_cap,6,iterate::quadIndices);
    glu::draw(pRVar12,dVar9,1,(VertexArrayBinding *)local_668,(PrimitiveList *)&results.m_data.m_cap
              ,(DrawUtilCallback *)0x0);
    dVar9 = (**(code **)(lStack_28 + 0x800))();
    glu::checkError(dVar9,"Draw quad",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcSampleVariablesTests.cpp"
                    ,0x1ca);
    local_a08 = (VertexArrayBinding *)&vertexArrays_1[0].pointer.data;
    do {
      local_a08 = local_a08 + -1;
      glu::VertexArrayBinding::~VertexArrayBinding(local_a08);
    } while (local_a08 != (VertexArrayBinding *)local_668);
    glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_470);
    this_00 = &pixels.super_ConstPixelBufferAccess.m_data;
    tcu::TextureLevel::TextureLevel((TextureLevel *)this_00,&this->m_texFormat,fbo,0x10,1);
    tcu::TextureLevel::getAccess
              ((PixelBufferAccess *)
               &result.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,(TextureLevel *)this_00);
    iVar8 = tcu::ConstPixelBufferAccess::getHeight
                      ((ConstPixelBufferAccess *)
                       &result.
                        super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    iVar11 = tcu::ConstPixelBufferAccess::getWidth
                       ((ConstPixelBufferAccess *)
                        &result.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    this_01 = (allocator<tcu::Vector<float,_4>_> *)
              ((long)&data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage + 7);
    std::allocator<tcu::Vector<float,_4>_>::allocator(this_01);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_718,
               (long)(iVar8 * iVar11),this_01);
    std::allocator<tcu::Vector<float,_4>_>::~allocator
              ((allocator<tcu::Vector<float,_4>_> *)
               ((long)&data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    pTVar16 = tcu::ConstPixelBufferAccess::getFormat
                        ((ConstPixelBufferAccess *)
                         &result.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (pTVar16->type == SIGNED_INT8) {
      iVar8 = tcu::ConstPixelBufferAccess::getHeight
                        ((ConstPixelBufferAccess *)
                         &result.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      iVar11 = tcu::ConstPixelBufferAccess::getWidth
                         ((ConstPixelBufferAccess *)
                          &result.
                           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::allocator<int>::allocator(&local_739);
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&i,(long)(iVar8 * iVar11 * 4),&local_739);
      std::allocator<int>::~allocator(&local_739);
      pcVar5 = *(code **)(lStack_28 + 0x1220);
      iVar8 = tcu::ConstPixelBufferAccess::getWidth
                        ((ConstPixelBufferAccess *)
                         &result.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      iVar11 = tcu::ConstPixelBufferAccess::getHeight
                         ((ConstPixelBufferAccess *)
                          &result.
                           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
      pvVar17 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)&i,0);
      (*pcVar5)(0,0,iVar8,iVar11,0x8d99,0x1404,pvVar17);
      for (local_740 = 0;
          sVar18 = std::vector<int,_std::allocator<int>_>::size
                             ((vector<int,_std::allocator<int>_> *)&i), local_740 < sVar18;
          local_740 = local_740 + 4) {
        pvVar17 = std::vector<int,_std::allocator<int>_>::operator[]
                            ((vector<int,_std::allocator<int>_> *)&i,(ulong)local_740);
        iVar8 = *pvVar17;
        pvVar17 = std::vector<int,_std::allocator<int>_>::operator[]
                            ((vector<int,_std::allocator<int>_> *)&i,(ulong)(local_740 + 1));
        iVar11 = *pvVar17;
        pvVar17 = std::vector<int,_std::allocator<int>_>::operator[]
                            ((vector<int,_std::allocator<int>_> *)&i,(ulong)(local_740 + 2));
        iVar1 = *pvVar17;
        pvVar17 = std::vector<int,_std::allocator<int>_>::operator[]
                            ((vector<int,_std::allocator<int>_> *)&i,(ulong)(local_740 + 3));
        tcu::Vector<float,_4>::Vector
                  ((Vector<float,_4> *)
                   &data_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,(float)iVar8,(float)iVar11,
                   (float)iVar1,(float)*pvVar17);
        pvVar19 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                  operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              *)local_718,(ulong)(local_740 >> 2));
        *(pointer *)pvVar19->m_data =
             data_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        *(undefined8 *)(pvVar19->m_data + 2) = local_748;
      }
      std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&i);
    }
    else {
      pTVar16 = tcu::ConstPixelBufferAccess::getFormat
                          ((ConstPixelBufferAccess *)
                           &result.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (pTVar16->type == UNSIGNED_INT8) {
        iVar8 = tcu::ConstPixelBufferAccess::getHeight
                          ((ConstPixelBufferAccess *)
                           &result.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
        iVar11 = tcu::ConstPixelBufferAccess::getWidth
                           ((ConstPixelBufferAccess *)
                            &result.
                             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::allocator<unsigned_int>::allocator(&local_769);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i_1,
                   (long)(iVar8 * iVar11 * 4),&local_769);
        std::allocator<unsigned_int>::~allocator(&local_769);
        pcVar5 = *(code **)(lStack_28 + 0x1220);
        iVar8 = tcu::ConstPixelBufferAccess::getWidth
                          ((ConstPixelBufferAccess *)
                           &result.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
        iVar11 = tcu::ConstPixelBufferAccess::getHeight
                           ((ConstPixelBufferAccess *)
                            &result.
                             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
        pvVar20 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i_1,0);
        (*pcVar5)(0,0,iVar8,iVar11,0x8d99,0x1405,pvVar20);
        for (local_770 = 0; uVar21 = (ulong)local_770,
            sVar18 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                               ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i_1),
            uVar21 < sVar18; local_770 = local_770 + 4) {
          pvVar20 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i_1,
                               (ulong)local_770);
          uVar2 = *pvVar20;
          pvVar20 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i_1,
                               (ulong)(local_770 + 1));
          uVar3 = *pvVar20;
          pvVar20 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i_1,
                               (ulong)(local_770 + 2));
          uVar4 = *pvVar20;
          pvVar20 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i_1,
                               (ulong)(local_770 + 3));
          tcu::Vector<float,_4>::Vector
                    ((Vector<float,_4> *)&x,(float)uVar2,(float)uVar3,(float)uVar4,(float)*pvVar20);
          pvVar19 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                    operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                *)local_718,(ulong)(local_770 >> 2));
          *(undefined8 *)pvVar19->m_data = _x;
          *(float (*) [2])(pvVar19->m_data + 2) = local_778;
        }
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i_1);
      }
      else {
        pRVar12 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
        glu::readPixels(pRVar12,0,0,
                        (PixelBufferAccess *)
                        &result.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
    }
    for (samples = 0; samples < 0x10; samples = samples + 1) {
      for (sample = 0; sample < 0x10; sample = sample + 1) {
        if (this->m_samples == 0) {
          local_b1c = 1.4013e-45;
        }
        else {
          local_b1c = (float)this->m_samples;
        }
        pixel.m_data[3] = local_b1c;
        for (pixel.m_data[2] = 0.0; (int)pixel.m_data[2] < (int)pixel.m_data[3];
            pixel.m_data[2] = (float)((int)pixel.m_data[2] + 1)) {
          tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_7a0);
          pTVar16 = tcu::ConstPixelBufferAccess::getFormat
                              ((ConstPixelBufferAccess *)
                               &result.
                                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
          if ((pTVar16->type == SIGNED_INT8) ||
             (pTVar16 = tcu::ConstPixelBufferAccess::getFormat
                                  ((ConstPixelBufferAccess *)
                                   &result.
                                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage),
             pTVar16->type == UNSIGNED_INT8)) {
            pTVar16 = (TextureFormat *)
                      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                      operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                  *)local_718,
                                 (long)(samples * 0x10 + sample * (int)pixel.m_data[3] +
                                       (int)pixel.m_data[2]));
            local_7a0 = *(undefined1 (*) [8])pTVar16;
            pixel.m_data._0_8_ = pTVar16[1];
          }
          else {
            tcu::ConstPixelBufferAccess::getPixel
                      ((ConstPixelBufferAccess *)local_7b0,
                       (int)&result.
                             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                       sample * (int)pixel.m_data[3] + (int)pixel.m_data[2],samples);
            local_7a0 = (undefined1  [8])local_7b0._0_8_;
            pixel.m_data[0] = (float)local_7b0._8_4_;
            pixel.m_data[1] = (float)local_7b0._12_4_;
          }
          if ((this->m_samples == 0) ||
             ((this->m_sampleMask & 1 << (SUB41(pixel.m_data[2],0) & 0x1f)) != 0)) {
            tcu::Vector<float,_4>::Vector(&local_7c0,1.0,0.0,0.0,1.0);
            bVar7 = tcu::Vector<float,_4>::operator!=((Vector<float,_4> *)local_7a0,&local_7c0);
            if (bVar7) {
              maxSamples._3_1_ = 0;
            }
          }
          else {
            tcu::Vector<float,_4>::Vector(&local_7d0,0.0,1.0,0.0,1.0);
            bVar7 = tcu::Vector<float,_4>::operator!=((Vector<float,_4> *)local_7a0,&local_7d0);
            if (bVar7) {
              maxSamples._3_1_ = 0;
            }
          }
        }
      }
    }
    pcVar5 = *(code **)(lStack_28 + 0x78);
    pRVar12 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
    iVar8 = (*pRVar12->_vptr_RenderContext[6])();
    (*pcVar5)(0x8d40,iVar8);
    (**(code **)(lStack_28 + 0x440))
              (1,(undefined1 *)((long)&program_1.m_program.m_info.linkTimeUs + 4));
    (**(code **)(lStack_28 + 0xa0))(0x8d41,0);
    (**(code **)(lStack_28 + 0x460))(1,&local_398);
    (**(code **)(lStack_28 + 0xb8))(local_3c,0);
    (**(code **)(lStack_28 + 0x480))(1,&fboMs);
    if ((maxSamples._3_1_ & 1) == 0) {
      local_b60 = "Fail";
    }
    else {
      local_b60 = "Pass";
    }
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               (uint)((maxSamples._3_1_ & 1) == 0),local_b60);
    this_local._4_4_ = STOP;
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_718);
    tcu::TextureLevel::~TextureLevel((TextureLevel *)&pixels.super_ConstPixelBufferAccess.m_data);
  }
  return this_local._4_4_;
}

Assistant:

SampleShadingMaskCase::IterateResult SampleShadingMaskCase::iterate()
{
	TestLog&			  log			  = m_testCtx.getLog();
	const glw::Functions& gl			  = m_context.getRenderContext().getFunctions();
	bool				  isOk			  = true;
	bool				  supportsRgba32f = false;

	if (m_glslVersion == glu::GLSL_VERSION_310_ES &&
		!m_context.getContextInfo().isExtensionSupported("GL_OES_sample_variables"))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "GL_OES_sample_variables");
		return STOP;
	}

	supportsRgba32f = isContextTypeGLCore(m_context.getRenderContext().getType()) ?
						  true :
						  (m_context.getContextInfo().isExtensionSupported("GL_EXT_color_buffer_float") ||
						   m_context.getContextInfo().isExtensionSupported("GL_ARB_color_buffer_float"));

	if (m_internalFormat == GL_RGBA32F && !supportsRgba32f)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Internalformat rgba32f not supported");
		return STOP;
	}

	GLint maxSamples;
	if (((m_texFormat.type == tcu::TextureFormat::FLOAT) && (m_texFormat.order == tcu::TextureFormat::RGBA)) ||
		((m_texFormat.type == tcu::TextureFormat::FLOAT) && (m_texFormat.order == tcu::TextureFormat::RG)) ||
		((m_texFormat.type == tcu::TextureFormat::FLOAT) && (m_texFormat.order == tcu::TextureFormat::R)) ||
		((m_texFormat.type == tcu::TextureFormat::HALF_FLOAT) && (m_texFormat.order == tcu::TextureFormat::RGBA)))
	{
		gl.getInternalformativ(GL_TEXTURE_2D_MULTISAMPLE, m_internalFormat, GL_SAMPLES, 1, &maxSamples);
		if (m_samples > maxSamples)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED,
									"Test sample count greater than samples that the format supports");
			return STOP;
		}
	}
	else if (m_texFormat.type == tcu::TextureFormat::SIGNED_INT8 ||
			 m_texFormat.type == tcu::TextureFormat::UNSIGNED_INT8)
	{
		gl.getIntegerv(GL_MAX_INTEGER_SAMPLES, &maxSamples);
		if (m_samples > maxSamples)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Test sample count greater than MAX_INTEGER_SAMPLES");
			return STOP;
		}
	}
	else
	{
		gl.getIntegerv(GL_MAX_SAMPLES, &maxSamples);
		if (m_samples > maxSamples)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Test sample count greater than MAX_SAMPLES");
			return STOP;
		}
	}

	// Create a multisample texture, or a regular texture if samples is zero.
	GLuint tex;
	gl.genTextures(1, &tex);
	GLenum target;
	if (m_samples)
	{
		target = GL_TEXTURE_2D_MULTISAMPLE;
		gl.bindTexture(target, tex);
		gl.texStorage2DMultisample(GL_TEXTURE_2D_MULTISAMPLE, m_samples, m_internalFormat, WIDTH, HEIGHT, GL_FALSE);
	}
	else
	{
		target = GL_TEXTURE_2D;
		gl.bindTexture(target, tex);
		gl.texStorage2D(GL_TEXTURE_2D, 1, m_internalFormat, WIDTH, HEIGHT);
		if (m_texFormat.type == tcu::TextureFormat::SIGNED_INT8 ||
			m_texFormat.type == tcu::TextureFormat::UNSIGNED_INT8 || m_texFormat.type == tcu::TextureFormat::FLOAT)
		{
			gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
			gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		}
	}

	// Create a framebuffer with the texture attached and clear to "green".
	GLuint fboMs;
	gl.genFramebuffers(1, &fboMs);
	gl.bindFramebuffer(GL_FRAMEBUFFER, fboMs);
	gl.framebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, target, tex, 0);
	gl.viewport(0, 0, WIDTH, HEIGHT);
	if (m_texFormat.type == tcu::TextureFormat::SIGNED_INT8)
	{
		GLint color[4] = { 0, 1, 0, 1 };
		gl.clearBufferiv(GL_COLOR, 0, color);
	}
	else if (m_texFormat.type == tcu::TextureFormat::UNSIGNED_INT8)
	{
		GLuint color[4] = { 0, 1, 0, 1 };
		gl.clearBufferuiv(GL_COLOR, 0, color);
	}
	else
	{
		GLfloat color[4] = { 0.0f, 1.0f, 0.0f, 1.0f };
		gl.clearBufferfv(GL_COLOR, 0, color);
	}

	static deUint16 const quadIndices[] = { 0, 1, 2, 2, 1, 3 };

	{
		// Draw a quad setting all samples to "red". We only expect "red"
		// to be written if the sample mask bit for that sample is 1.

		static char const* vss = "${VERSION_DECL}\n"
								 "in highp vec2 a_position;\n"
								 "void main()\n"
								 "{\n"
								 "   gl_Position = vec4(a_position, 0.0, 1.0);\n"
								 "}\n";

		static char const* fss = "${VERSION_DECL}\n"
								 "${OES_SV_RQ}"
								 "layout(location = 0) out highp ${OUT_TYPE} o_color;\n"
								 "uniform int u_sampleMask;\n"
								 "void main()\n"
								 "{\n"
								 "    for (int i = 0; i < (gl_NumSamples + 31) / 32; ++i) {\n"
								 "        gl_SampleMask[i] = u_sampleMask & gl_SampleMaskIn[i];\n"
								 "    }\n"
								 "    o_color = ${OUT_TYPE}(1, 0, 0, 1);\n"
								 "}\n";

		glu::ShaderProgram program(
			m_context.getRenderContext(),
			glu::makeVtxFragSources(specializeVersion(vss, m_glslVersion, m_sampler, m_outType).c_str(),
									specializeVersion(fss, m_glslVersion, m_sampler, m_outType).c_str()));
		log << program;
		if (!program.isOk())
		{
			TCU_FAIL("Compile failed");
		}

		static float const position[] = {
			-1.0f, -1.0f, -1.0f, +1.0f, +1.0f, -1.0f, +1.0f, +1.0f,
		};

		gl.useProgram(program.getProgram());
		gl.uniform1i(gl.getUniformLocation(program.getProgram(), "u_sampleMask"), m_sampleMask);

		glu::VertexArrayBinding vertexArrays[] = {
			glu::va::Float("a_position", 2, 4, 0, &position[0]),
		};
		glu::draw(m_context.getRenderContext(), program.getProgram(), DE_LENGTH_OF_ARRAY(vertexArrays),
				  &vertexArrays[0], glu::pr::TriangleStrip(DE_LENGTH_OF_ARRAY(quadIndices), &quadIndices[0]));

		GLU_EXPECT_NO_ERROR(gl.getError(), "Draw quad");
	}

	gl.bindFramebuffer(GL_FRAMEBUFFER, m_context.getRenderContext().getDefaultFramebuffer());
	gl.deleteFramebuffers(1, &fboMs);

	GLsizei width = WIDTH * ((m_samples) ? m_samples : 1);

	GLuint rbo;
	gl.genRenderbuffers(1, &rbo);
	gl.bindRenderbuffer(GL_RENDERBUFFER, rbo);
	gl.renderbufferStorage(GL_RENDERBUFFER, m_internalFormat, width, HEIGHT);

	GLuint fbo;
	gl.genFramebuffers(1, &fbo);
	gl.bindFramebuffer(GL_FRAMEBUFFER, fbo);
	gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, rbo);
	gl.viewport(0, 0, width, HEIGHT);

	{
		// Resolve the multi-sample texture into a render-buffer sized such that
		// the width can hold all samples of a pixel.
		static char const* vss = "${VERSION_DECL}\n"
								 "in highp vec2 a_position;\n"
								 "void main(void)\n"
								 "{\n"
								 "   gl_Position = vec4(a_position, 0.0, 1.0);\n"
								 "}\n";

		static char const* fss = "${VERSION_DECL}\n"
								 "uniform highp ${SAMPLER} u_tex;\n"
								 "uniform highp ${SAMPLER}MS u_texMS;\n"
								 "uniform int u_samples;\n"
								 "layout(location = 0) out highp ${OUT_TYPE} o_color;\n"
								 "void main(void)\n"
								 "{\n"
								 "    if (u_samples > 0) {\n"
								 "        ivec2 coord = ivec2(int(gl_FragCoord.x) / u_samples, gl_FragCoord.y);\n"
								 "        int sampleId = int(gl_FragCoord.x) % u_samples;\n"
								 "        o_color = texelFetch(u_texMS, coord, sampleId);\n"
								 "    } else {\n"
								 "        ivec2 coord = ivec2(gl_FragCoord.x, gl_FragCoord.y);\n"
								 "       o_color = texelFetch(u_tex, coord, 0);\n"
								 "    }\n"
								 "}\n";

		glu::ShaderProgram program(
			m_context.getRenderContext(),
			glu::makeVtxFragSources(specializeVersion(vss, m_glslVersion, m_sampler, m_outType).c_str(),
									specializeVersion(fss, m_glslVersion, m_sampler, m_outType).c_str()));
		log << program;
		if (!program.isOk())
		{
			TCU_FAIL("Compile failed");
		}

		static float const position[] = {
			-1.0f, -1.0f, -1.0f, +1.0f, +1.0f, -1.0f, +1.0f, +1.0f,
		};

		gl.useProgram(program.getProgram());
		gl.uniform1i(gl.getUniformLocation(program.getProgram(), "u_samples"), m_samples);
		if (m_samples > 0)
		{
			// only MS sampler needed, TU 1 is not used
			gl.uniform1i(gl.getUniformLocation(program.getProgram(), "u_tex"), 1);
			gl.uniform1i(gl.getUniformLocation(program.getProgram(), "u_texMS"), 0);
		}
		else
		{
			// only non-MS sampler needed, TU 1 is not used
			gl.uniform1i(gl.getUniformLocation(program.getProgram(), "u_tex"), 0);
			gl.uniform1i(gl.getUniformLocation(program.getProgram(), "u_texMS"), 1);
		}

		glu::VertexArrayBinding vertexArrays[] = {
			glu::va::Float("a_position", 2, 4, 0, &position[0]),
		};
		glu::draw(m_context.getRenderContext(), program.getProgram(), DE_LENGTH_OF_ARRAY(vertexArrays),
				  &vertexArrays[0], glu::pr::TriangleStrip(DE_LENGTH_OF_ARRAY(quadIndices), &quadIndices[0]));

		GLU_EXPECT_NO_ERROR(gl.getError(), "Draw quad");
	}

	tcu::TextureLevel	  results(m_texFormat, width, HEIGHT);
	tcu::PixelBufferAccess pixels = results.getAccess();
	std::vector<tcu::Vec4> result(pixels.getHeight() * pixels.getWidth());

	if (pixels.getFormat().type == tcu::TextureFormat::SIGNED_INT8)
	{
		std::vector<GLint> data(pixels.getHeight() * pixels.getWidth() * 4);
		gl.readPixels(0, 0, pixels.getWidth(), pixels.getHeight(), GL_RGBA_INTEGER, GL_INT, &data[0]);
		for (unsigned int i = 0; i < data.size(); i += 4)
		{
			result[i / 4] =
				tcu::Vec4((GLfloat)data[i], (GLfloat)data[i + 1], (GLfloat)data[i + 2], (GLfloat)data[i + 3]);
		}
	}
	else if (pixels.getFormat().type == tcu::TextureFormat::UNSIGNED_INT8)
	{
		std::vector<GLuint> data(pixels.getHeight() * pixels.getWidth() * 4);
		gl.readPixels(0, 0, pixels.getWidth(), pixels.getHeight(), GL_RGBA_INTEGER, GL_UNSIGNED_INT, &data[0]);
		for (unsigned int i = 0; i < data.size(); i += 4)
		{
			result[i / 4] =
				tcu::Vec4((GLfloat)data[i], (GLfloat)data[i + 1], (GLfloat)data[i + 2], (GLfloat)data[i + 3]);
		}
	}
	else
	{
		glu::readPixels(m_context.getRenderContext(), 0, 0, pixels);
	}

	for (int y = 0; y < HEIGHT; ++y)
	{
		for (int x = 0; x < WIDTH; ++x)
		{
			GLint samples = (m_samples) ? m_samples : 1;
			for (int sample = 0; sample < samples; ++sample)
			{
				tcu::Vec4 pixel;
				if (pixels.getFormat().type == tcu::TextureFormat::SIGNED_INT8 ||
					pixels.getFormat().type == tcu::TextureFormat::UNSIGNED_INT8)
				{
					pixel = result[y * WIDTH + x * samples + sample];
				}
				else
				{
					pixel = pixels.getPixel(x * samples + sample, y);
				}

				// Make sure only those samples where the sample mask bit is
				// non-zero have the "red" pixel values.
				if (!m_samples || (m_sampleMask & (1 << sample)))
				{
					if (pixel != tcu::Vec4(1.0f, 0.0f, 0.0f, 1.0f))
					{
						isOk = false;
					}
				}
				else
				{
					if (pixel != tcu::Vec4(0.0f, 1.0f, 0.0f, 1.0f))
					{
						isOk = false;
					}
				}
			}
		}
	}

	gl.bindFramebuffer(GL_FRAMEBUFFER, m_context.getRenderContext().getDefaultFramebuffer());
	gl.deleteFramebuffers(1, &fbo);

	gl.bindRenderbuffer(GL_RENDERBUFFER, 0);
	gl.deleteRenderbuffers(1, &rbo);

	gl.bindTexture(target, 0);
	gl.deleteTextures(1, &tex);

	m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS : QP_TEST_RESULT_FAIL, isOk ? "Pass" : "Fail");
	return STOP;
}